

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O0

RegSlot __thiscall FuncInfo::NextVarRegister(FuncInfo *this)

{
  RegSlot RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegSlot reg;
  FuncInfo *this_local;
  
  if (this->firstTmpReg != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0xe0,"(this->firstTmpReg == Js::Constants::NoRegister)",
                       "Shouldn\'t assign var register after we start allocating temp reg");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  RVar1 = this->varRegsCount;
  UInt32Math::Inc(&this->varRegsCount);
  return RVar1;
}

Assistant:

Js::RegSlot NextVarRegister()
    {
        AssertMsg(this->firstTmpReg == Js::Constants::NoRegister, "Shouldn't assign var register after we start allocating temp reg");
        Js::RegSlot reg = varRegsCount;
        UInt32Math::Inc(varRegsCount);
        return REGSLOT_TO_VARREG(reg);
    }